

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plane3d.h
# Opt level: O0

bool __thiscall
irr::core::plane3d<float>::getIntersectionWithLine
          (plane3d<float> *this,vector3d<float> *linePoint,vector3d<float> *lineVect,
          vector3d<float> *outIntersection)

{
  undefined8 *in_RCX;
  vector3d<float> *in_RDX;
  vector3d<float> *in_RSI;
  vector3d<float> *in_RDI;
  float fVar1;
  vector3d<float> vVar2;
  float t;
  float t2;
  undefined4 in_stack_ffffffffffffff98;
  float in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  bool local_1;
  
  fVar1 = vector3d<float>::dotProduct(in_RDI,in_RDX);
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    vector3d<float>::dotProduct(in_RDI,in_RSI);
    vector3d<float>::operator*
              ((vector3d<float> *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff9c);
    vVar2 = vector3d<float>::operator+
                      ((vector3d<float> *)
                       CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                       (vector3d<float> *)
                       CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    *in_RCX = vVar2._0_8_;
    *(float *)(in_RCX + 1) = vVar2.Z;
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool getIntersectionWithLine(const vector3d<T> &linePoint,
			const vector3d<T> &lineVect,
			vector3d<T> &outIntersection) const
	{
		T t2 = Normal.dotProduct(lineVect);

		if (t2 == 0)
			return false;

		T t = -(Normal.dotProduct(linePoint) + D) / t2;
		outIntersection = linePoint + (lineVect * t);
		return true;
	}